

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O0

BN_MONT_CTX * BN_MONT_CTX_copy(BN_MONT_CTX *to,BN_MONT_CTX *from)

{
  BIGNUM *pBVar1;
  BN_MONT_CTX *local_8;
  
  local_8 = to;
  if (to != from) {
    pBVar1 = BN_copy(&to->RR,&from->RR);
    if (pBVar1 == (BIGNUM *)0x0) {
      local_8 = (BN_MONT_CTX *)0x0;
    }
    else {
      pBVar1 = BN_copy(&to->N,&from->N);
      if (pBVar1 == (BIGNUM *)0x0) {
        local_8 = (BN_MONT_CTX *)0x0;
      }
      else {
        pBVar1 = BN_copy(&to->Ni,&from->Ni);
        if (pBVar1 == (BIGNUM *)0x0) {
          local_8 = (BN_MONT_CTX *)0x0;
        }
        else {
          to->ri = from->ri;
          to->n0[0] = from->n0[0];
          to->n0[1] = from->n0[1];
        }
      }
    }
  }
  return local_8;
}

Assistant:

BN_MONT_CTX *BN_MONT_CTX_copy(BN_MONT_CTX *to, BN_MONT_CTX *from)
{
    if (to == from)
        return (to);

    if (!BN_copy(&(to->RR), &(from->RR)))
        return NULL;
    if (!BN_copy(&(to->N), &(from->N)))
        return NULL;
    if (!BN_copy(&(to->Ni), &(from->Ni)))
        return NULL;
    to->ri = from->ri;
    to->n0[0] = from->n0[0];
    to->n0[1] = from->n0[1];
    return (to);
}